

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  long lVar1;
  ImDrawList *draw_list;
  undefined4 in_ESI;
  long in_RDI;
  float fVar2;
  float start_x;
  ImGuiWindow *window;
  ImGuiTableColumn *column;
  float local_28;
  float local_24;
  int idx;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0x74) = in_ESI;
  draw_list = (ImDrawList *)
              ImSpan<ImGuiTableColumn>::operator[]
                        ((ImSpan<ImGuiTableColumn> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  lVar1 = *(long *)(in_RDI + 0x168);
  if ((*(uint *)(in_RDI + 0x94) & 1) == 0) {
    local_28 = *(float *)&draw_list->field_0x34;
  }
  else {
    local_28 = *(float *)&draw_list->_Data;
  }
  local_24 = local_28;
  if (((ulong)(draw_list->IdxBuffer).Data & 0x4000) != 0) {
    local_24 = *(float *)(in_RDI + 0x90) + local_28;
  }
  *(float *)(lVar1 + 0xd0) = local_24;
  *(float *)(lVar1 + 0xd4) = *(float *)(in_RDI + 0x80) + *(float *)(in_RDI + 0xc0);
  *(undefined4 *)(lVar1 + 0xe8) = *(undefined4 *)(lVar1 + 0xd0);
  *(float *)(lVar1 + 0x10c) = (local_24 - *(float *)(lVar1 + 0x10)) - *(float *)(lVar1 + 0x108);
  *(undefined4 *)(lVar1 + 0x100) = *(undefined4 *)(in_RDI + 0x8c);
  *(undefined4 *)(lVar1 + 0x114) = 0;
  *(undefined4 *)(lVar1 + 0x254) = *(undefined4 *)(lVar1 + 0xd4);
  *(float *)(lVar1 + 0x250) =
       *(float *)((long)&(draw_list->IdxBuffer).Data + 4) + *(float *)(in_RDI + 0xb8);
  *(float *)(lVar1 + 600) = (float)(draw_list->VtxBuffer).Size - *(float *)(in_RDI + 0xbc);
  if (((ulong)draw_list->_VtxWritePtr & 0x1000000000000) == 0) {
    fVar2 = ImMax<float>(*(float *)(lVar1 + 0xd4),*(float *)(in_RDI + 0x84));
    *(float *)(lVar1 + 0xd4) = fVar2;
  }
  *(byte *)(lVar1 + 0x83) = *(byte *)((long)&draw_list->_IdxWritePtr + 1) & 1;
  idx = (int)((ulong)lVar1 >> 0x20);
  if ((*(uint *)(in_RDI + 4) & 0x4000) == 0) {
    SetWindowClipRectBeforeSetChannel
              ((ImGuiWindow *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(ImRect *)draw_list);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),draw_list,idx);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),draw_list,idx);
  }
  return;
}

Assistant:

void    ImGui::TableBeginCell(ImGuiTable* table, int column_n)
{
    table->CurrentColumn = column_n;
    ImGuiTableColumn* column = &table->Columns[column_n];
    ImGuiWindow* window = table->InnerWindow;

    // Start position is roughly ~~ CellRect.Min + CellPadding + Indent
    float start_x = (table->RowFlags & ImGuiTableRowFlags_Headers) ? column->StartXHeaders : column->StartXRows;
    if (column->Flags & ImGuiTableColumnFlags_IndentEnable)
        start_x += table->RowIndentOffsetX; // ~~ += window.DC.Indent.x - table->HostIndentX, except we locked it for the row.

    window->DC.CursorPos.x = start_x;
    window->DC.CursorPos.y = table->RowPosY1 + table->CellPaddingY;
    window->DC.CursorMaxPos.x = window->DC.CursorPos.x;
    window->DC.ColumnsOffset.x = start_x - window->Pos.x - window->DC.Indent.x; // FIXME-WORKRECT
    window->DC.CurrLineTextBaseOffset = table->RowTextBaseline;
    window->DC.LastItemId = 0;

    window->WorkRect.Min.y = window->DC.CursorPos.y;
    window->WorkRect.Min.x = column->MinX + table->CellPaddingX1;
    window->WorkRect.Max.x = column->MaxX - table->CellPaddingX2;

    // To allow ImGuiListClipper to function we propagate our row height
    if (!column->IsVisible)
        window->DC.CursorPos.y = ImMax(window->DC.CursorPos.y, table->RowPosY2);

    window->SkipItems = column->SkipItems;
    if (table->Flags & ImGuiTableFlags_NoClipX)
    {
        table->DrawSplitter.SetCurrentChannel(window->DrawList, 1);
    }
    else
    {
        SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
    }
}